

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,bool clean,bool fast,
          bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  reference pvVar6;
  GeneratedMakeCommand *pGVar7;
  size_type sVar8;
  cmake *this_00;
  pointer command_00;
  cmState *this_01;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  rep local_240;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_238;
  string local_230;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_210;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_208;
  iterator command;
  string makeCommandStr;
  cmListFileBacktrace local_1d8;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_153;
  undefined1 local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  iterator local_128;
  size_type local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined1 local_100 [8];
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string *outputPtr;
  string outputBuffer;
  int retVal;
  undefined1 local_90 [8];
  cmWorkingDirectory workdir;
  bool hideconsole;
  bool verbose_local;
  bool fast_local;
  bool clean_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *projectName_local;
  string *bindir_local;
  string *param_2_local;
  int jobs_local;
  cmGlobalGenerator *this_local;
  cmDuration timeout_local;
  
  workdir._39_1_ = clean;
  workdir._38_1_ = fast;
  workdir._37_1_ = verbose;
  workdir._36_1_ = cmSystemTools::GetRunCommandHideConsole();
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_90,bindir);
  std::__cxx11::string::operator+=((string *)output,"Change Dir: ");
  std::__cxx11::string::operator+=((string *)output,(string *)bindir);
  std::__cxx11::string::operator+=((string *)output,"\n");
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_90);
  if (bVar2) {
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
    iVar3 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_90);
    pcVar5 = strerror(iVar3);
    cmSystemTools::Error("Failed to change directory: ",pcVar5,(char *)0x0,(char *)0x0);
    std::__cxx11::string::operator+=((string *)output,"Failed to change directory: ");
    iVar3 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_90);
    pcVar5 = strerror(iVar3);
    std::__cxx11::string::operator+=((string *)output,pcVar5);
    std::__cxx11::string::operator+=((string *)output,"\n");
    timeout_local.__r._4_4_ = 1;
    goto LAB_003d0afc;
  }
  outputBuffer.field_2._12_4_ = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::__cxx11::string::string((string *)&outputPtr);
  (*this->_vptr_cmGlobalGenerator[0x11])
            (&cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,makeCommandCSTR,projectName,
             bindir,targets,config,(byte)workdir._38_1_ & 1,jobs,(byte)workdir._37_1_ & 1,
             nativeOptions);
  if ((outputflag == OUTPUT_PASSTHROUGH) &&
     (pvVar6 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::back((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)&cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
     ((pvVar6->super_GeneratedMakeCommand).RequiresOutputForward & 1U) != 0)) {
    outputflag = OUTPUT_FORWARD;
  }
  if ((workdir._39_1_ & 1) == 0) {
LAB_003d0750:
    std::__cxx11::string::string((string *)&command);
    std::__cxx11::string::operator+=((string *)output,"\nRun Build Command(s):");
    local_208._M_current =
         (GeneratedMakeCommand *)
         std::
         vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
         ::begin((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_210._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_208,&local_210);
      if (!bVar2) break;
      pGVar7 = &__gnu_cxx::
                __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                ::operator->(&local_208)->super_GeneratedMakeCommand;
      detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_230,pGVar7);
      std::__cxx11::string::operator=((string *)&command,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      local_238._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_208,&local_238);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)&command," && ");
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&command);
      command_00 = __gnu_cxx::
                   __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                   ::operator->(&local_208);
      local_240 = timeout.__r;
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)command_00,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (!bVar2) {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
        std::operator+(&local_260,"Generator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        cmSystemTools::Error(&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::operator+(&local_2a0,"\nGenerator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        std::operator+(&local_280,&local_2a0,"\n");
        std::__cxx11::string::operator+=((string *)output,(string *)&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        timeout_local.__r._4_4_ = 1;
        goto LAB_003d0aac;
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
      ::operator++(&local_208);
    }
    std::__cxx11::string::operator+=((string *)output,"\n");
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
    this_01 = cmake::GetState(this->CMakeInstance);
    bVar2 = cmState::UseWatcomWMake(this_01);
    if (((bVar2) && (outputBuffer.field_2._12_4_ == 0)) &&
       (lVar9 = std::__cxx11::string::find((char *)output,0x752345), lVar9 != -1)) {
      outputBuffer.field_2._12_4_ = 1;
    }
    timeout_local.__r._4_4_ = outputBuffer.field_2._12_4_;
LAB_003d0aac:
    std::__cxx11::string::~string((string *)&command);
  }
  else {
    local_152 = 1;
    local_150 = &local_148;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"clean",&local_151);
    local_152 = 0;
    local_128 = &local_148;
    local_120 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_153);
    __l._M_len = local_120;
    __l._M_array = local_128;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_118,__l,&local_153);
    uVar1 = workdir._37_1_;
    uVar4 = (uint)(byte)workdir._38_1_;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178);
    (*this->_vptr_cmGlobalGenerator[0x11])
              (local_100,this,makeCommandCSTR,projectName,bindir,&local_118,config,uVar4 & 1,jobs,
               (byte)uVar1 & 1,&local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_153);
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128;
    do {
      local_318 = local_318 + -1;
      std::__cxx11::string::~string((string *)local_318);
    } while (local_318 != &local_148);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::operator+=((string *)output,"\nRun Clean Command:");
    pGVar7 = &std::
              vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)local_100)->super_GeneratedMakeCommand;
    detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_198,pGVar7);
    std::__cxx11::string::operator+=((string *)output,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::operator+=((string *)output,"\n");
    sVar8 = std::
            vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ::size((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                    *)local_100);
    if (sVar8 == 1) {
      pvVar6 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                        *)local_100);
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pvVar6,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        bVar2 = false;
      }
      else {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._36_1_ & 1));
        cmSystemTools::Error
                  ("Generator: execution of make clean failed.",(char *)0x0,(char *)0x0,(char *)0x0)
        ;
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::__cxx11::string::operator+=
                  ((string *)output,"\nGenerator: execution of make clean failed.\n");
        timeout_local.__r._4_4_ = 1;
        bVar2 = true;
      }
    }
    else {
      this_00 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 &local_1b9);
      local_1d8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1d8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_1d8);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_1b8,&local_1d8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      timeout_local.__r._4_4_ = 1;
      bVar2 = true;
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)local_100);
    if (!bVar2) goto LAB_003d0750;
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
             *)&cleanCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&outputPtr);
LAB_003d0afc:
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_90);
  return timeout_local.__r._4_4_;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, bool clean, bool fast, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    cmSystemTools::Error("Failed to change directory: ",
                         std::strerror(workdir.GetLastResult()));
    output += "Failed to change directory: ";
    output += std::strerror(workdir.GetLastResult());
    output += "\n";
    return 1;
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand =
    this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir, targets,
                               config, fast, jobs, verbose, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, config, fast, jobs, verbose);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  for (auto command = makeCommand.begin(); command != makeCommand.end();
       ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}